

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cpp
# Opt level: O1

void vera::computeSmoothingNormals
               (attrib_t *_attrib,shape_t *_shape,
               map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
               *smoothVertexNormals)

{
  _Rb_tree_header *p_Var1;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar2;
  float fVar3;
  pointer pfVar4;
  _Base_ptr p_Var5;
  mapped_type *pmVar6;
  _Rb_tree_node_base *p_Var7;
  pointer paVar8;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *paVar9;
  _Base_ptr p_Var10;
  _Rb_tree_header *p_Var11;
  long lVar12;
  key_type_conflict *__k;
  ulong uVar13;
  _Self __tmp;
  size_t i_1;
  float fVar14;
  vec3 normal;
  int vi [3];
  vec3 v [3];
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_78;
  float fStack_74;
  float local_70;
  int local_6c [3];
  attrib_t *local_60;
  vec3 local_58;
  vec3 local_4c;
  vec3 local_40;
  
  local_60 = _attrib;
  std::
  _Rb_tree<int,_std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>,_std::_Select1st<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
  ::clear(&smoothVertexNormals->_M_t);
  paVar8 = (_shape->mesh).indices.
           super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (2 < (ulong)(((long)(_shape->mesh).indices.
                         super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)paVar8 >> 2) *
                 -0x5555555555555555)) {
    p_Var1 = &(smoothVertexNormals->_M_t)._M_impl.super__Rb_tree_header;
    uVar13 = 0;
    do {
      local_6c[0] = paVar8[uVar13 * 3].vertex_index;
      local_6c[1] = paVar8[uVar13 * 3 + 1].vertex_index;
      local_6c[2] = paVar8[uVar13 * 3 + 2].vertex_index;
      pfVar4 = (local_60->vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      paVar9 = &local_58.field_2;
      lVar12 = 0;
      do {
        aVar2 = *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
                 (pfVar4 + (long)local_6c[lVar12] * 3 + 2);
        *(undefined8 *)(paVar9 + -2) = *(undefined8 *)(pfVar4 + (long)local_6c[lVar12] * 3);
        *paVar9 = aVar2;
        lVar12 = lVar12 + 1;
        paVar9 = paVar9 + 3;
      } while (lVar12 != 3);
      calcNormal(&local_58,&local_4c,&local_40,(vec3 *)&local_78);
      lVar12 = 0;
      do {
        __k = local_6c + lVar12;
        p_Var10 = (smoothVertexNormals->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var5 = &p_Var1->_M_header;
        if (p_Var10 != (_Base_ptr)0x0) {
          do {
            if (*__k <= (int)*(size_t *)(p_Var10 + 1)) {
              p_Var5 = p_Var10;
            }
            p_Var10 = (&p_Var10->_M_left)[(int)*(size_t *)(p_Var10 + 1) < *__k];
          } while (p_Var10 != (_Base_ptr)0x0);
        }
        p_Var11 = p_Var1;
        if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
           (p_Var11 = (_Rb_tree_header *)p_Var5,
           *__k < (int)((_Rb_tree_header *)p_Var5)->_M_node_count)) {
          p_Var11 = p_Var1;
        }
        if (p_Var11 == p_Var1) {
          pmVar6 = std::
                   map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                   ::operator[](smoothVertexNormals,__k);
          pmVar6->field_0 = local_78;
          pmVar6->field_1 =
               (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)fStack_74;
          (pmVar6->field_2).z = local_70;
        }
        else {
          *(float *)((long)&p_Var11->_M_node_count + 4) =
               local_78.x + *(float *)((long)&p_Var11->_M_node_count + 4);
          *(float *)(p_Var11 + 1) = fStack_74 + *(float *)(p_Var11 + 1);
          *(float *)((long)(p_Var11 + 1) + 4) = local_70 + *(float *)((long)(p_Var11 + 1) + 4);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      paVar8 = (_shape->mesh).indices.
               super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar13 = uVar13 + 1;
    } while (uVar13 < (ulong)(((long)(_shape->mesh).indices.
                                     super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)paVar8 >> 2)
                             * -0x5555555555555555) / 3);
  }
  for (p_Var7 = (smoothVertexNormals->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != &(smoothVertexNormals->_M_t)._M_impl.super__Rb_tree_header;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    fVar14 = *(float *)((long)&p_Var7[1]._M_parent + 4);
    fVar14 = fVar14 * fVar14 +
             *(float *)&p_Var7[1]._M_parent * *(float *)&p_Var7[1]._M_parent +
             *(float *)&p_Var7[1].field_0x4 * *(float *)&p_Var7[1].field_0x4;
    if (fVar14 < 0.0) {
      fVar14 = sqrtf(fVar14);
    }
    else {
      fVar14 = SQRT(fVar14);
    }
    fVar14 = 1.0 / fVar14;
    fVar3 = *(float *)((long)&p_Var7[1]._M_parent + 4);
    *(ulong *)&p_Var7[1].field_0x4 =
         CONCAT44(*(float *)&p_Var7[1]._M_parent * fVar14,*(float *)&p_Var7[1].field_0x4 * fVar14);
    *(float *)((long)&p_Var7[1]._M_parent + 4) = fVar14 * fVar3;
  }
  return;
}

Assistant:

void computeSmoothingNormals(const tinyobj::attrib_t& _attrib, const tinyobj::shape_t& _shape, std::map<int, glm::vec3>& smoothVertexNormals) {
    smoothVertexNormals.clear();

    std::map<int, glm::vec3>::iterator iter;

    for (size_t f = 0; f < _shape.mesh.indices.size() / 3; f++) {
        // Get the three indexes of the face (all faces are triangular)
        tinyobj::index_t idx0 = _shape.mesh.indices[3 * f + 0];
        tinyobj::index_t idx1 = _shape.mesh.indices[3 * f + 1];
        tinyobj::index_t idx2 = _shape.mesh.indices[3 * f + 2];

        // Get the three vertex indexes and coordinates
        int vi[3];      // indexes
        vi[0] = idx0.vertex_index;
        vi[1] = idx1.vertex_index;
        vi[2] = idx2.vertex_index;

        glm::vec3 v[3];  // coordinates
        for (size_t i = 0; i < 3; i++)
            v[i] = getVertex(_attrib, vi[i]);

        // Compute the normal of the face
        glm::vec3 normal;
        calcNormal(v[0], v[1], v[2], normal);

        // Add the normal to the three vertexes
        for (size_t i = 0; i < 3; ++i) {
            iter = smoothVertexNormals.find(vi[i]);
            // add
            if (iter != smoothVertexNormals.end())
                iter->second += normal;
            else
                smoothVertexNormals[vi[i]] = normal;
        }
    }  // f

    // Normalize the normals, that is, make them unit vectors
    for (iter = smoothVertexNormals.begin(); iter != smoothVertexNormals.end(); iter++) {
        iter->second = glm::normalize(iter->second);
    }
}